

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uint has_alpha,uchar *in,
                        LodePNGColorMode *mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uchar uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uchar *puVar13;
  byte *pbVar14;
  uchar *puVar15;
  ulong uVar16;
  
  uVar4 = 4 - (has_alpha == 0);
  switch(mode->colortype) {
  case LCT_GREY:
    uVar11 = mode->bitdepth;
    if (uVar11 == 8) {
      if (numpixels != 0) {
        puVar13 = buffer + 3;
        sVar8 = 0;
        do {
          uVar6 = in[sVar8];
          puVar13[-1] = uVar6;
          puVar13[-2] = uVar6;
          puVar13[-3] = uVar6;
          if (has_alpha != 0) {
            if (mode->key_defined == 0) {
              uVar6 = 0xff;
            }
            else {
              uVar6 = -(mode->key_r != (uint)in[sVar8]);
            }
            *puVar13 = uVar6;
          }
          sVar8 = sVar8 + 1;
          puVar13 = puVar13 + uVar4;
        } while (numpixels != sVar8);
      }
    }
    else if (uVar11 == 0x10) {
      if (numpixels != 0) {
        puVar13 = buffer + 3;
        sVar8 = 0;
        do {
          uVar6 = in[sVar8 * 2];
          puVar13[-1] = uVar6;
          puVar13[-2] = uVar6;
          puVar13[-3] = uVar6;
          if (has_alpha != 0) {
            if (mode->key_defined == 0) {
              uVar6 = 0xff;
            }
            else {
              uVar6 = -((uint)(ushort)(*(ushort *)(in + sVar8 * 2) << 8 |
                                      *(ushort *)(in + sVar8 * 2) >> 8) != mode->key_r);
            }
            *puVar13 = uVar6;
          }
          sVar8 = sVar8 + 1;
          puVar13 = puVar13 + uVar4;
        } while (numpixels != sVar8);
      }
    }
    else if (numpixels != 0) {
      sVar8 = 0;
      uVar16 = 0;
      do {
        uVar5 = (ulong)mode->bitdepth;
        uVar12 = 0;
        uVar10 = uVar5;
        if (uVar5 != 0) {
          do {
            uVar9 = uVar16 >> 3;
            bVar1 = (byte)uVar16;
            uVar16 = uVar16 + 1;
            uVar12 = uVar12 + ((uint)((in[uVar9] >> (~bVar1 & 7) & 1) != 0) <<
                              ((byte)(uVar10 - 1) & 0x1f));
            uVar9 = uVar10 - 2;
            uVar10 = uVar10 - 1;
          } while (uVar9 < uVar5);
        }
        uVar6 = (uchar)((uVar12 * 0xff) / (uint)~(-1 << ((byte)uVar11 & 0x1f)));
        buffer[2] = uVar6;
        buffer[1] = uVar6;
        *buffer = uVar6;
        if (has_alpha != 0) {
          if (mode->key_defined == 0) {
            uVar6 = 0xff;
          }
          else {
            uVar6 = -(uVar12 != mode->key_r);
          }
          buffer[3] = uVar6;
        }
        sVar8 = sVar8 + 1;
        buffer = buffer + uVar4;
      } while (sVar8 != numpixels);
    }
    break;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar13 = buffer + 3;
        pbVar14 = in + 2;
        do {
          bVar1 = pbVar14[-2];
          puVar13[-3] = bVar1;
          bVar2 = pbVar14[-1];
          puVar13[-2] = bVar2;
          bVar3 = *pbVar14;
          puVar13[-1] = bVar3;
          if (has_alpha != 0) {
            uVar6 = 0xff;
            if (((mode->key_defined != 0) && (mode->key_r == (uint)bVar1)) &&
               (mode->key_g == (uint)bVar2)) {
              uVar6 = -(mode->key_b != (uint)bVar3);
            }
            *puVar13 = uVar6;
          }
          puVar13 = puVar13 + uVar4;
          pbVar14 = pbVar14 + 3;
          numpixels = numpixels - 1;
        } while (numpixels != 0);
      }
    }
    else if (numpixels != 0) {
      puVar13 = buffer + 3;
      puVar15 = in + 5;
      do {
        puVar13[-3] = puVar15[-5];
        puVar13[-2] = puVar15[-3];
        puVar13[-1] = puVar15[-1];
        if (has_alpha != 0) {
          uVar6 = 0xff;
          if (((mode->key_defined != 0) &&
              ((uint)(ushort)(*(ushort *)(puVar15 + -5) << 8 | *(ushort *)(puVar15 + -5) >> 8) ==
               mode->key_r)) &&
             ((uint)(ushort)(*(ushort *)(puVar15 + -3) << 8 | *(ushort *)(puVar15 + -3) >> 8) ==
              mode->key_g)) {
            uVar6 = -((uint)(ushort)(*(ushort *)(puVar15 + -1) << 8 | *(ushort *)(puVar15 + -1) >> 8
                                    ) != mode->key_b);
          }
          *puVar13 = uVar6;
        }
        puVar13 = puVar13 + uVar4;
        puVar15 = puVar15 + 6;
        numpixels = numpixels - 1;
      } while (numpixels != 0);
    }
    break;
  case LCT_PALETTE:
    if (numpixels != 0) {
      sVar8 = 0;
      uVar16 = 0;
      do {
        uVar10 = (ulong)mode->bitdepth;
        if (uVar10 == 8) {
          uVar9 = (ulong)in[sVar8];
        }
        else {
          uVar9 = 0;
          uVar5 = uVar10;
          if (uVar10 != 0) {
            do {
              uVar7 = uVar16 >> 3;
              bVar1 = (byte)uVar16;
              uVar16 = uVar16 + 1;
              uVar9 = (ulong)((int)uVar9 +
                             ((uint)((in[uVar7] >> (~bVar1 & 7) & 1) != 0) <<
                             ((byte)(uVar5 - 1) & 0x1f)));
              uVar7 = uVar5 - 2;
              uVar5 = uVar5 - 1;
            } while (uVar7 < uVar10);
          }
        }
        if (uVar9 < mode->palettesize) {
          uVar11 = (int)uVar9 << 2;
          *buffer = mode->palette[uVar11];
          buffer[1] = mode->palette[(ulong)uVar11 + 1];
          buffer[2] = mode->palette[(ulong)uVar11 + 2];
          if (has_alpha != 0) {
            uVar6 = mode->palette[(ulong)uVar11 + 3];
LAB_001a8fff:
            buffer[3] = uVar6;
          }
        }
        else {
          buffer[2] = '\0';
          buffer[0] = '\0';
          buffer[1] = '\0';
          uVar6 = 0xff;
          if (has_alpha != 0) goto LAB_001a8fff;
        }
        sVar8 = sVar8 + 1;
        buffer = buffer + uVar4;
      } while (sVar8 != numpixels);
    }
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar13 = buffer + 3;
        sVar8 = 0;
        do {
          uVar6 = in[sVar8 * 2];
          puVar13[-1] = uVar6;
          puVar13[-2] = uVar6;
          puVar13[-3] = uVar6;
          if (has_alpha != 0) {
            *puVar13 = in[sVar8 * 2 + 1];
          }
          sVar8 = sVar8 + 1;
          puVar13 = puVar13 + uVar4;
        } while (numpixels != sVar8);
      }
    }
    else if (numpixels != 0) {
      puVar13 = buffer + 3;
      sVar8 = 0;
      do {
        uVar6 = in[sVar8 * 4];
        puVar13[-1] = uVar6;
        puVar13[-2] = uVar6;
        puVar13[-3] = uVar6;
        if (has_alpha != 0) {
          *puVar13 = in[sVar8 * 4 + 2];
        }
        sVar8 = sVar8 + 1;
        puVar13 = puVar13 + uVar4;
      } while (numpixels != sVar8);
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar13 = buffer + 3;
        sVar8 = 0;
        do {
          puVar13[-3] = in[sVar8 * 4];
          puVar13[-2] = in[sVar8 * 4 + 1];
          puVar13[-1] = in[sVar8 * 4 + 2];
          if (has_alpha != 0) {
            *puVar13 = in[sVar8 * 4 + 3];
          }
          sVar8 = sVar8 + 1;
          puVar13 = puVar13 + uVar4;
        } while (numpixels != sVar8);
      }
    }
    else if (numpixels != 0) {
      puVar13 = buffer + 3;
      sVar8 = 0;
      do {
        puVar13[-3] = in[sVar8 * 8];
        puVar13[-2] = in[sVar8 * 8 + 2];
        puVar13[-1] = in[sVar8 * 8 + 4];
        if (has_alpha != 0) {
          *puVar13 = in[sVar8 * 8 + 6];
        }
        sVar8 = sVar8 + 1;
        puVar13 = puVar13 + uVar4;
      } while (numpixels != sVar8);
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* buffer, size_t numpixels,
                                unsigned has_alpha, const unsigned char* in,
                                const LodePNGColorMode* mode)
{
  unsigned num_channels = has_alpha ? 4 : 3;
  size_t i;
  if(mode->colortype == LCT_GREY)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i];
        if(has_alpha) buffer[3] = mode->key_defined && in[i] == mode->key_r ? 0 : 255;
      }
    }
    else if(mode->bitdepth == 16)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2];
        if(has_alpha) buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
      }
    }
    else
    {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
        buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
        if(has_alpha) buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
      }
    }
  }
  else if(mode->colortype == LCT_RGB)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 3 + 0];
        buffer[1] = in[i * 3 + 1];
        buffer[2] = in[i * 3 + 2];
        if(has_alpha) buffer[3] = mode->key_defined && buffer[0] == mode->key_r
           && buffer[1]== mode->key_g && buffer[2] == mode->key_b ? 0 : 255;
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 6 + 0];
        buffer[1] = in[i * 6 + 2];
        buffer[2] = in[i * 6 + 4];
        if(has_alpha) buffer[3] = mode->key_defined
           && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
           && 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
           && 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
      }
    }
  }
  else if(mode->colortype == LCT_PALETTE)
  {
    unsigned index;
    size_t j = 0;
    for(i = 0; i != numpixels; ++i, buffer += num_channels)
    {
      if(mode->bitdepth == 8) index = in[i];
      else index = readBitsFromReversedStream(&j, in, mode->bitdepth);

      if(index >= mode->palettesize)
      {
        /*This is an error according to the PNG spec, but most PNG decoders make it black instead.
        Done here too, slightly faster due to no error handling needed.*/
        buffer[0] = buffer[1] = buffer[2] = 0;
        if(has_alpha) buffer[3] = 255;
      }
      else
      {
        buffer[0] = mode->palette[index * 4 + 0];
        buffer[1] = mode->palette[index * 4 + 1];
        buffer[2] = mode->palette[index * 4 + 2];
        if(has_alpha) buffer[3] = mode->palette[index * 4 + 3];
      }
    }
  }
  else if(mode->colortype == LCT_GREY_ALPHA)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
        if(has_alpha) buffer[3] = in[i * 2 + 1];
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
        if(has_alpha) buffer[3] = in[i * 4 + 2];
      }
    }
  }
  else if(mode->colortype == LCT_RGBA)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 4 + 0];
        buffer[1] = in[i * 4 + 1];
        buffer[2] = in[i * 4 + 2];
        if(has_alpha) buffer[3] = in[i * 4 + 3];
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 8 + 0];
        buffer[1] = in[i * 8 + 2];
        buffer[2] = in[i * 8 + 4];
        if(has_alpha) buffer[3] = in[i * 8 + 6];
      }
    }
  }
}